

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NamespaceScope.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::NamespaceScope::addPrefix(NamespaceScope *this,XMLCh *prefixToAdd,uint uriId)

{
  RefHashTableOf<xercesc_4_0::XMLStringPool::PoolElem,_xercesc_4_0::StringHasher> *pRVar1;
  StackElem *toExpand;
  PrefMapElem *pPVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  EmptyStackException *this_00;
  RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *pRVar7;
  XMLCh *pXVar8;
  XMLCh XVar9;
  
  if (this->fStackTop == 0) {
    this_00 = (EmptyStackException *)__cxa_allocate_exception(0x30);
    EmptyStackException::EmptyStackException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/NamespaceScope.cpp"
               ,0x9e,ElemStack_EmptyStack,this->fMemoryManager);
    __cxa_throw(this_00,&EmptyStackException::typeinfo,XMLException::~XMLException);
  }
  pRVar1 = (this->fPrefixPool).fHashTable;
  toExpand = this->fStack[this->fStackTop - 1];
  if ((prefixToAdd == (XMLCh *)0x0) || (uVar6 = (ulong)(ushort)*prefixToAdd, uVar6 == 0)) {
    uVar6 = 0;
  }
  else {
    XVar9 = prefixToAdd[1];
    if (XVar9 != L'\0') {
      pXVar8 = prefixToAdd + 2;
      do {
        uVar6 = (ulong)(ushort)XVar9 + (uVar6 >> 0x18) + uVar6 * 0x26;
        XVar9 = *pXVar8;
        pXVar8 = pXVar8 + 1;
      } while (XVar9 != L'\0');
    }
    uVar6 = uVar6 % pRVar1->fHashModulus;
  }
  pRVar7 = pRVar1->fBucketList[uVar6];
  if (pRVar7 != (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0) {
    do {
      bVar3 = StringHasher::equals((StringHasher *)&pRVar1->field_0x30,prefixToAdd,pRVar7->fKey);
      if (bVar3) {
        if (pRVar7->fData != (PoolElem *)0x0) {
          uVar4 = pRVar7->fData->fId;
          goto LAB_00312b85;
        }
        break;
      }
      pRVar7 = pRVar7->fNext;
    } while (pRVar7 != (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0);
  }
  uVar4 = XMLStringPool::addNewEntry(&this->fPrefixPool,prefixToAdd);
LAB_00312b85:
  uVar5 = toExpand->fMapCount;
  if ((ulong)uVar5 != 0) {
    uVar6 = 0;
    do {
      if (toExpand->fMap[uVar6].fPrefId == uVar4) {
        toExpand->fMap[uVar6].fURIId = uriId;
        return;
      }
      uVar6 = uVar6 + 1;
    } while (uVar5 != uVar6);
  }
  if (uVar5 == toExpand->fMapCapacity) {
    expandMap(this,toExpand);
    uVar5 = toExpand->fMapCount;
  }
  pPVar2 = toExpand->fMap;
  pPVar2[uVar5].fPrefId = uVar4;
  pPVar2[uVar5].fURIId = uriId;
  toExpand->fMapCount = uVar5 + 1;
  return;
}

Assistant:

void NamespaceScope::addPrefix(const XMLCh* const prefixToAdd,
                               const unsigned int uriId) {

    if (!fStackTop)
        ThrowXMLwithMemMgr(EmptyStackException, XMLExcepts::ElemStack_EmptyStack, fMemoryManager);

    // Get a convenience pointer to the stack top row
    StackElem* curRow = fStack[fStackTop - 1];

    // Map the prefix to its unique id
    const unsigned int prefId = fPrefixPool.addOrFind(prefixToAdd);

    // Search the map at this level for the passed prefix
    for (unsigned int mapIndex = 0; mapIndex < curRow->fMapCount; mapIndex++)
    {
        if (curRow->fMap[mapIndex].fPrefId == prefId)
        {
            curRow->fMap[mapIndex].fURIId = uriId;
            return;
        }
    }

    //
    //  Add a new element to the prefix map for this element. If its full,
    //  then expand it out.
    //
    if (curRow->fMapCount == curRow->fMapCapacity)
        expandMap(curRow);

    //
    //  And now add a new element for this prefix.
    //
    curRow->fMap[curRow->fMapCount].fPrefId = prefId;
    curRow->fMap[curRow->fMapCount].fURIId = uriId;

    // Bump the map count now
    curRow->fMapCount++;
}